

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_property.cpp
# Opt level: O2

void tst_bounded_property(void)

{
  uint __line;
  ostream *poVar1;
  socklen_t in_ECX;
  sockaddr *__addr;
  char *__assertion;
  undefined1 local_f0 [28];
  undefined4 local_d4;
  undefined4 local_d0;
  undefined1 local_c8 [28];
  undefined4 local_ac;
  undefined4 local_a8;
  undefined1 local_a0 [28];
  undefined4 local_84;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  BoundedProperty<float> local_60;
  char local_31 [8];
  bool called;
  
  local_f0._0_8_ = (pointer)0x0;
  local_f0._8_4_ = 0;
  local_f0._12_4_ = 0;
  local_f0._16_4_ = 0;
  local_f0._20_8_ = 0;
  local_d4 = 0x3f800000;
  local_d0 = 0x3f800000;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_8_ = 0;
  local_ac = 0x3f800000;
  local_a8 = 0x3f000000;
  local_a0._0_8_ = (pointer)0x0;
  local_a0._8_4_ = 0;
  local_a0._12_4_ = 0;
  local_a0._16_4_ = 0;
  local_a0._20_8_ = 0;
  local_84 = 0x3f800000;
  local_60.super_Property<float>.m_t = 0.0;
  local_60.super_Property<float>.m_listeners.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.super_Property<float>.m_listeners.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60.super_Property<float>.m_listeners.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60.super_Property<float>.m_listeners.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_60._28_8_ = 0;
  local_60.m_max = 1.0;
  local_80._0_4_ = 0x41200000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  if ((local_60.super_Property<float>.m_t != 1.0) || (NAN(local_60.super_Property<float>.m_t))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
    std::operator<<(poVar1,"\' vs \'");
    poVar1 = std::ostream::_M_insert<double>(1.0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((local_60.super_Property<float>.m_t != 1.0) || (NAN(local_60.super_Property<float>.m_t))) {
      __assertion = "(v) == (1.0f)";
      __line = 0x39;
      goto LAB_0010a74c;
    }
  }
  local_80._0_4_ = 0x41200000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  if ((local_60.super_Property<float>.m_t != 1.0) || (NAN(local_60.super_Property<float>.m_t))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
    std::operator<<(poVar1,"\' vs \'");
    poVar1 = std::ostream::_M_insert<double>(1.0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((local_60.super_Property<float>.m_t != 1.0) || (NAN(local_60.super_Property<float>.m_t))) {
      __assertion = "(v) == (1.0f)";
      __line = 0x3b;
      goto LAB_0010a74c;
    }
  }
  local_80._0_4_ = 0xc1200000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
    std::operator<<(poVar1,"\' vs \'");
    poVar1 = std::ostream::_M_insert<double>(0.0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))) {
      __assertion = "(v) == (0.0f)";
      __line = 0x3d;
      goto LAB_0010a74c;
    }
  }
  local_80._0_4_ = 0xc1200000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
    std::operator<<(poVar1,"\' vs \'");
    poVar1 = std::ostream::_M_insert<double>(0.0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))) {
      __assertion = "(v) == (0.0f)";
      __line = 0x3f;
      goto LAB_0010a74c;
    }
  }
  local_31[0] = '\0';
  local_80._M_unused._M_member_pointer = local_80._M_unused._M_member_pointer & 0xffffffff00000000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  local_80._8_8_ = 0;
  local_80._M_unused._M_object = local_31;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp:68:15)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp:68:15)>
             ::_M_manager;
  rengine::Property<float>::connect(&local_60.super_Property<float>,(int)&local_80,__addr,in_ECX);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  local_80._0_4_ = 0x3f000000;
  rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
  if ((local_60.super_Property<float>.m_t != 0.5) || (NAN(local_60.super_Property<float>.m_t))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
    std::operator<<(poVar1,"\' vs \'");
    poVar1 = std::ostream::_M_insert<double>(0.5);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((local_60.super_Property<float>.m_t != 0.5) || (NAN(local_60.super_Property<float>.m_t))) {
      __assertion = "(v) == (0.5f)";
      __line = 0x47;
      goto LAB_0010a74c;
    }
  }
  if (local_31[0] == '\0') {
    __assertion = "called";
    __line = 0x48;
  }
  else {
    local_31[0] = '\0';
    local_80._0_4_ = 0xbf800000;
    rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
    if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
      std::operator<<(poVar1,"\' vs \'");
      poVar1 = std::ostream::_M_insert<double>(0.0);
      poVar1 = std::operator<<(poVar1,"\'");
      std::endl<char,std::char_traits<char>>(poVar1);
      if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t)))
      {
        __assertion = "(v) == (0.0f)";
        __line = 0x4c;
        goto LAB_0010a74c;
      }
    }
    if (local_31[0] == '\0') {
      __assertion = "called";
      __line = 0x4d;
    }
    else {
      local_31[0] = '\0';
      local_80._0_4_ = 0xc0000000;
      rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
      if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t)))
      {
        poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
        std::operator<<(poVar1,"\' vs \'");
        poVar1 = std::ostream::_M_insert<double>(0.0);
        poVar1 = std::operator<<(poVar1,"\'");
        std::endl<char,std::char_traits<char>>(poVar1);
        if ((local_60.super_Property<float>.m_t != 0.0) || (NAN(local_60.super_Property<float>.m_t))
           ) {
          __assertion = "(v) == (0.0f)";
          __line = 0x51;
          goto LAB_0010a74c;
        }
      }
      if (local_31[0] == '\x01') {
        __assertion = "!called";
        __line = 0x52;
      }
      else {
        local_31[0] = '\0';
        local_80._0_4_ = 0x41200000;
        rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
        if ((local_60.super_Property<float>.m_t != 1.0) || (NAN(local_60.super_Property<float>.m_t))
           ) {
          poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
          std::operator<<(poVar1,"\' vs \'");
          poVar1 = std::ostream::_M_insert<double>(1.0);
          poVar1 = std::operator<<(poVar1,"\'");
          std::endl<char,std::char_traits<char>>(poVar1);
          if ((local_60.super_Property<float>.m_t != 1.0) ||
             (NAN(local_60.super_Property<float>.m_t))) {
            __assertion = "(v) == (1.0f)";
            __line = 0x56;
            goto LAB_0010a74c;
          }
        }
        if (local_31[0] == '\0') {
          __assertion = "called";
          __line = 0x57;
        }
        else {
          local_31[0] = '\0';
          local_80._0_4_ = 0x42c80000;
          rengine::BoundedProperty<float>::set(&local_60,(float *)&local_80);
          if ((local_60.super_Property<float>.m_t != 1.0) ||
             (NAN(local_60.super_Property<float>.m_t))) {
            poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60.super_Property<float>.m_t);
            std::operator<<(poVar1,"\' vs \'");
            poVar1 = std::ostream::_M_insert<double>(1.0);
            poVar1 = std::operator<<(poVar1,"\'");
            std::endl<char,std::char_traits<char>>(poVar1);
            if ((local_60.super_Property<float>.m_t != 1.0) ||
               (NAN(local_60.super_Property<float>.m_t))) {
              __assertion = "(v) == (1.0f)";
              __line = 0x5b;
              goto LAB_0010a74c;
            }
          }
          if (local_31[0] != '\x01') {
            poVar1 = std::operator<<((ostream *)&std::cout,"void tst_bounded_property()");
            poVar1 = std::operator<<(poVar1,": ok");
            std::endl<char,std::char_traits<char>>(poVar1);
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                      (&local_60.super_Property<float>.m_listeners);
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       local_a0);
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       local_c8);
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       local_f0);
            return;
          }
          __assertion = "!called";
          __line = 0x5c;
        }
      }
    }
  }
LAB_0010a74c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                ,__line,"void tst_bounded_property()");
}

Assistant:

void tst_bounded_property()
{
    BoundedProperty<float> float_under { 0.0f, 1.0f, -2.0f };
    check_equal(float_under, 0.0f);

    BoundedProperty<float> float_over { 0.0f, 1.0f, 2.0f };
    check_equal(float_over, 1.0f)

    BoundedProperty<float> float_valid { 0.0f, 1.0f, 0.5f };
    check_equal(float_valid, 0.5f);

    BoundedProperty<float> v(0.0f, 1.0f);
    check_equal(v, 0.0f);

    // Check setters
    v.set(10.0f);
    check_equal(v, 1.0f);
    v = 10.0f;
    check_equal(v, 1.0f);
    v.set(-10.0f);
    check_equal(v, 0.0f);
    v = -10.0f;
    check_equal(v, 0.0f);

    // Check that notifiers are called only when inside range
    bool called = false;
    v = 0.0f;
    v.connect([&]() { called = true; });

    v = 0.5f;
    check_equal(v, 0.5f);
    check_true(called);

    called = false;
    v = -1.0f;
    check_equal(v, 0.0f);
    check_true(called);

    called = false;
    v = -2.0f;
    check_equal(v, 0.0f);
    check_true(!called);

    called = false;
    v = 10.0f;
    check_equal(v, 1.0f);
    check_true(called);

    called = false;
    v = 100.0f;
    check_equal(v, 1.0f);
    check_true(!called);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}